

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void blogc_debug_template(bc_slist_t *ast)

{
  char *pcVar1;
  undefined8 uVar2;
  FILE *__stream;
  char *pcVar3;
  blogc_template_node_t *data;
  bc_slist_t *tmp;
  bc_slist_t *ast_local;
  
  for (data = (blogc_template_node_t *)ast; data != (blogc_template_node_t *)0x0;
      data = *(blogc_template_node_t **)data) {
    pcVar1 = data->data[0];
    fprintf(_stderr,"DEBUG: <TEMPLATE ");
    __stream = _stderr;
    switch(*(undefined4 *)pcVar1) {
    case 1:
      fprintf(_stderr,"IFDEF: %s",*(undefined8 *)(pcVar1 + 8));
      break;
    case 2:
      fprintf(_stderr,"IFNDEF: %s",*(undefined8 *)(pcVar1 + 8));
      break;
    case 3:
      uVar2 = *(undefined8 *)(pcVar1 + 8);
      pcVar3 = get_operator(*(blogc_template_operator_t *)(pcVar1 + 4));
      fprintf(__stream,"IF: %s %s %s",uVar2,pcVar3,*(undefined8 *)(pcVar1 + 0x10));
      break;
    case 4:
      fprintf(_stderr,"ELSE");
      break;
    case 5:
      fprintf(_stderr,"ENDIF");
      break;
    case 6:
      fprintf(_stderr,"FOREACH: %s",*(undefined8 *)(pcVar1 + 8));
      break;
    case 7:
      fprintf(_stderr,"ENDFOREACH");
      break;
    case 8:
      fprintf(_stderr,"BLOCK: %s",*(undefined8 *)(pcVar1 + 8));
      break;
    case 9:
      fprintf(_stderr,"ENDBLOCK");
      break;
    case 10:
      fprintf(_stderr,"VARIABLE: %s",*(undefined8 *)(pcVar1 + 8));
      break;
    case 0xb:
      fprintf(_stderr,"CONTENT: `%s`",*(undefined8 *)(pcVar1 + 8));
    }
    fprintf(_stderr,">\n");
  }
  return;
}

Assistant:

void
blogc_debug_template(bc_slist_t *ast)
{
    for (bc_slist_t *tmp = ast; tmp != NULL; tmp = tmp->next) {
        blogc_template_node_t *data = tmp->data;
        fprintf(stderr, "DEBUG: <TEMPLATE ");
        switch (data->type) {
            case BLOGC_TEMPLATE_NODE_IFDEF:
                fprintf(stderr, "IFDEF: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_IFNDEF:
                fprintf(stderr, "IFNDEF: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_IF:
                fprintf(stderr, "IF: %s %s %s", data->data[0],
                    get_operator(data->op), data->data[1]);
                break;
            case BLOGC_TEMPLATE_NODE_ELSE:
                fprintf(stderr, "ELSE");
                break;
            case BLOGC_TEMPLATE_NODE_ENDIF:
                fprintf(stderr, "ENDIF");
                break;
            case BLOGC_TEMPLATE_NODE_FOREACH:
                fprintf(stderr, "FOREACH: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_ENDFOREACH:
                fprintf(stderr, "ENDFOREACH");
                break;
            case BLOGC_TEMPLATE_NODE_BLOCK:
                fprintf(stderr, "BLOCK: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_ENDBLOCK:
                fprintf(stderr, "ENDBLOCK");
                break;
            case BLOGC_TEMPLATE_NODE_VARIABLE:
                fprintf(stderr, "VARIABLE: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_CONTENT:
                fprintf(stderr, "CONTENT: `%s`", data->data[0]);
                break;
        }
        fprintf(stderr, ">\n");
    }
}